

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_shuffle(REF_INT n,REF_INT *permutation)

{
  uint uVar1;
  REF_INT RVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (0 < n) {
    uVar6 = 0;
    do {
      permutation[uVar6] = (REF_INT)uVar6;
      uVar6 = uVar6 + 1;
    } while ((uint)n != uVar6);
  }
  if (1 < n) {
    uVar1 = n - 1;
    uVar6 = 0;
    do {
      iVar3 = rand();
      uVar4 = (uint)uVar6 + iVar3 % n;
      if ((int)uVar1 <= (int)uVar4) {
        uVar4 = uVar1;
      }
      uVar5 = (uint)uVar6;
      if (-1 < iVar3 % n) {
        uVar5 = uVar4;
      }
      RVar2 = permutation[(int)uVar5];
      permutation[(int)uVar5] = permutation[uVar6];
      permutation[uVar6] = RVar2;
      uVar6 = uVar6 + 1;
      n = n + -1;
    } while (uVar1 != uVar6);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_shuffle(REF_INT n, REF_INT *permutation) {
  REF_INT i, j, temp;
  for (i = 0; i < n; i++) permutation[i] = i;
  for (i = 0; i < n - 1; i++) {
    j = rand() % (n - 1 - i + 1) + i; /* i <= j < n */
    j = MAX(i, MIN(j, n - 1));        /* not needed, but don't trust myself */
    temp = permutation[j];
    permutation[j] = permutation[i];
    permutation[i] = temp;
  }
  return REF_SUCCESS;
}